

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O1

domain_type * __thiscall cs::domain_type::add_var(domain_type *this,string *name,var *val)

{
  size_t sVar1;
  unsigned_long local_40;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>::iterator,_bool>
  local_38;
  
  sVar1 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
          ::count<std::__cxx11::string>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                      *)this,name);
  if (sVar1 == 0) {
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::push_back(&this->m_slot,val);
    local_40 = ((long)(this->m_slot).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_slot).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) - 1;
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::
    emplace<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_long,_0>
              (&local_38,
               (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                *)this,name,&local_40);
  }
  else {
    phmap::priv::
    raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
    ::try_emplace_impl<std::__cxx11::string_const&>
              (&local_38,
               (raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                *)this,name);
    cs_impl::any::operator=
              ((this->m_slot).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
               _M_impl.super__Vector_impl_data._M_start +
               *(long *)((long)local_38.first.field_1.slot_ + 0x20),val);
  }
  return this;
}

Assistant:

domain_type &add_var(const std::string &name, const var &val)
		{
			if (m_reflect.count(name) == 0) {
				m_slot.push_back(val);
				m_reflect.emplace(name, m_slot.size() - 1);
			}
			else
				m_slot[m_reflect[name]] = val;
			return *this;
		}